

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateCompatibleInterfaceProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gtarget,ImportPropertyMap *properties)

{
  pointer pIVar1;
  cmGeneratorTarget *pcVar2;
  TargetType TVar3;
  cmMakefile *this_00;
  cmComputeLinkInformation *this_01;
  ItemVector *pIVar4;
  cmLocalGenerator *this_02;
  ostream *poVar5;
  string *psVar6;
  _Base_ptr p_Var7;
  cmExportFileGenerator *pcVar8;
  pointer pIVar9;
  pointer config;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifaceProperties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string local_1c8;
  ostringstream e;
  
  pcVar8 = (cmExportFileGenerator *)&e;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar8,"COMPATIBLE_INTERFACE_BOOL",(allocator<char> *)&ifaceProperties);
  PopulateInterfaceProperty(pcVar8,(string *)&e,gtarget,properties);
  std::__cxx11::string::~string((string *)&e);
  pcVar8 = (cmExportFileGenerator *)&e;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar8,"COMPATIBLE_INTERFACE_STRING",(allocator<char> *)&ifaceProperties);
  PopulateInterfaceProperty(pcVar8,(string *)&e,gtarget,properties);
  std::__cxx11::string::~string((string *)&e);
  pcVar8 = (cmExportFileGenerator *)&e;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar8,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator<char> *)&ifaceProperties)
  ;
  PopulateInterfaceProperty(pcVar8,(string *)&e,gtarget,properties);
  std::__cxx11::string::~string((string *)&e);
  pcVar8 = (cmExportFileGenerator *)&e;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar8,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator<char> *)&ifaceProperties)
  ;
  PopulateInterfaceProperty(pcVar8,(string *)&e,gtarget,properties);
  std::__cxx11::string::~string((string *)&e);
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"COMPATIBLE_INTERFACE_BOOL",(allocator<char> *)&local_1c8);
  getPropertyContents(gtarget,(string *)&e,&ifaceProperties);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"COMPATIBLE_INTERFACE_STRING",(allocator<char> *)&local_1c8);
  getPropertyContents(gtarget,(string *)&e,&ifaceProperties);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator<char> *)&local_1c8);
  getPropertyContents(gtarget,(string *)&e,&ifaceProperties);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator<char> *)&local_1c8);
  getPropertyContents(gtarget,(string *)&e,&ifaceProperties);
  std::__cxx11::string::~string((string *)&e);
  TVar3 = cmGeneratorTarget::GetType(gtarget);
  if (TVar3 != INTERFACE_LIBRARY) {
    this_00 = cmTarget::GetMakefile(gtarget->Target);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configNames,this_00,IncludeEmptyConfig);
    for (config = configNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        config != configNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
      TVar3 = cmGeneratorTarget::GetType(gtarget);
      if (TVar3 != OBJECT_LIBRARY) {
        this_01 = cmGeneratorTarget::GetLinkInformation(gtarget,config);
        if (this_01 == (cmComputeLinkInformation *)0x0) {
          this_02 = cmGeneratorTarget::GetLocalGenerator(gtarget);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar5 = std::operator<<((ostream *)&e,"Exporting the target \"");
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(gtarget);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::operator<<(poVar5,"\" is not allowed since its linker language cannot be determined")
          ;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(this_02,FATAL_ERROR,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        }
        else {
          pIVar4 = cmComputeLinkInformation::GetItems(this_01);
          pIVar1 = (pIVar4->
                   super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar9 = (pIVar4->
                        super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                        )._M_impl.super__Vector_impl_data._M_start; pIVar9 != pIVar1;
              pIVar9 = pIVar9 + 1) {
            if (pIVar9->Target != (cmGeneratorTarget *)0x0) {
              TVar3 = cmGeneratorTarget::GetType(pIVar9->Target);
              if (TVar3 != OBJECT_LIBRARY) {
                pcVar2 = pIVar9->Target;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,"COMPATIBLE_INTERFACE_BOOL",(allocator<char> *)&local_1c8);
                getPropertyContents(pcVar2,(string *)&e,&ifaceProperties);
                std::__cxx11::string::~string((string *)&e);
                pcVar2 = pIVar9->Target;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,"COMPATIBLE_INTERFACE_STRING",(allocator<char> *)&local_1c8)
                ;
                getPropertyContents(pcVar2,(string *)&e,&ifaceProperties);
                std::__cxx11::string::~string((string *)&e);
                pcVar2 = pIVar9->Target;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MIN",
                           (allocator<char> *)&local_1c8);
                getPropertyContents(pcVar2,(string *)&e,&ifaceProperties);
                std::__cxx11::string::~string((string *)&e);
                pcVar2 = pIVar9->Target;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,"COMPATIBLE_INTERFACE_NUMBER_MAX",
                           (allocator<char> *)&local_1c8);
                getPropertyContents(pcVar2,(string *)&e,&ifaceProperties);
                std::__cxx11::string::~string((string *)&e);
              }
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configNames);
  }
  for (p_Var7 = ifaceProperties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &ifaceProperties._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    pcVar8 = (cmExportFileGenerator *)&e;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   "INTERFACE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1)
                  );
    PopulateInterfaceProperty(pcVar8,(string *)&e,gtarget,properties);
    std::__cxx11::string::~string((string *)&e);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&ifaceProperties._M_t);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateCompatibleInterfaceProperties(
  cmGeneratorTarget const* gtarget, ImportPropertyMap& properties)
{
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_BOOL", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_STRING", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MIN", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MAX", gtarget,
                                  properties);

  std::set<std::string> ifaceProperties;

  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_BOOL", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_STRING", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                      ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                      ifaceProperties);

  if (gtarget->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    std::vector<std::string> configNames =
      gtarget->Target->GetMakefile()->GetGeneratorConfigs(
        cmMakefile::IncludeEmptyConfig);

    for (std::string const& cn : configNames) {
      getCompatibleInterfaceProperties(gtarget, ifaceProperties, cn);
    }
  }

  for (std::string const& ip : ifaceProperties) {
    this->PopulateInterfaceProperty("INTERFACE_" + ip, gtarget, properties);
  }
}